

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bake.c
# Opt level: O2

err_t bakeBMQVStep4(octet *out,octet *in,bake_cert *certa,void *state)

{
  octet *key_;
  u64 *stack;
  long lVar1;
  ulong m;
  ulong count;
  ec_o *ec;
  bool_t bVar2;
  err_t eVar3;
  int iVar4;
  u64 *dest;
  word *c;
  word wVar5;
  word *pwVar6;
  ulong n;
  word *a;
  
  bVar2 = objIsOperable(state);
  eVar3 = 0x6d;
  if (bVar2 != 0) {
    lVar1 = *(long *)(*(long *)((long)state + 0x18) + 0x18);
    m = *(ulong *)(lVar1 + 0x30);
    count = *(ulong *)(lVar1 + 0x38);
    bVar2 = memIsValid(in,count * 2 + (ulong)(*(int *)((long)state + 0x188) != 0) * 8);
    if ((((bVar2 != 0) &&
         (bVar2 = memIsValid(out,(ulong)(*(int *)((long)state + 0x18c) != 0) << 3), bVar2 != 0)) &&
        (bVar2 = memIsValid(certa,0x18), bVar2 != 0)) &&
       ((bVar2 = memIsValid(certa->data,certa->len), bVar2 != 0 &&
        (certa->val != (bake_certval_i)0x0)))) {
      a = (word *)(*state + (long)state);
      eVar3 = (*certa->val)((octet *)a,(bign_params *)((long)state + 0x38),certa->data,certa->len);
      if (eVar3 == 0) {
        pwVar6 = a + m * 2;
        dest = pwVar6 + m * 2;
        n = m >> 1;
        stack = dest + n * 2 + m + 2;
        iVar4 = (**(code **)(*(long *)(*(long *)((long)state + 0x18) + 0x18) + 0x40))(a,a);
        eVar3 = 0x202;
        if (((iVar4 != 0) &&
            (lVar1 = *(long *)(*(long *)((long)state + 0x18) + 0x18),
            iVar4 = (**(code **)(lVar1 + 0x40))(a + m,(long)a + count,lVar1,stack), iVar4 != 0)) &&
           (bVar2 = ecpIsOnA(a,*(ec_o **)((long)state + 0x18),stack), bVar2 != 0)) {
          lVar1 = *(long *)(*(long *)((long)state + 0x18) + 0x18);
          iVar4 = (**(code **)(lVar1 + 0x40))(pwVar6,in,lVar1,stack);
          eVar3 = 0x191;
          if (((iVar4 != 0) &&
              (lVar1 = *(long *)(*(long *)((long)state + 0x18) + 0x18),
              iVar4 = (**(code **)(lVar1 + 0x40))(pwVar6 + m,in + count,lVar1,stack), iVar4 != 0))
             && (bVar2 = ecpIsOnA(pwVar6,*(ec_o **)((long)state + 0x18),stack), bVar2 != 0)) {
            c = dest + n + 1;
            beltHashStart(stack);
            beltHashStepH(in,count,stack);
            beltHashStepH(*(void **)((long)state + 0x30),count,stack);
            beltHashStepG2((octet *)dest,count >> 1,stack);
            u64From(dest,dest,count >> 1);
            zzMul(c,dest,n,*(word **)((long)state + 0x20),m,stack);
            wVar5 = zzAdd2(c + n,*(word **)((long)state + 0x20),m);
            c[m + n] = wVar5;
            zzMod(c,c,m + n + 1,*(word **)(*(long *)((long)state + 0x18) + 0x38),m,stack);
            zzSubMod(c,*(word **)((long)state + 0x28),c,
                     *(word **)(*(long *)((long)state + 0x18) + 0x38),m);
            dest[n] = 1;
            bVar2 = ecMulA(a,a,*(ec_o **)((long)state + 0x18),dest,n + 1,stack);
            eVar3 = 0x1f6;
            if (bVar2 != 0) {
              bVar2 = ecpSubAA(pwVar6,pwVar6,a,*(ec_o **)((long)state + 0x18),stack);
              ec = *(ec_o **)((long)state + 0x18);
              if (bVar2 == 0) {
                (*ec->f->to)((octet *)a,ec->base,ec->f,stack);
              }
              else {
                bVar2 = ecMulA(pwVar6,pwVar6,ec,c,m,stack);
                if (bVar2 == 0) {
                  return 0x1f6;
                }
                lVar1 = *(long *)(*(long *)((long)state + 0x18) + 0x18);
                (**(code **)(lVar1 + 0x48))(a,pwVar6,lVar1,stack);
              }
              beltHashStart(stack);
              beltHashStepH(a,count,stack);
              beltHashStepH(certa->data,certa->len,stack);
              beltHashStepH(*(void **)((long)state + 0x1c0),*(size_t *)((long)state + 0x1c8),stack);
              if (*(void **)((long)state + 400) != (void *)0x0) {
                beltHashStepH(*(void **)((long)state + 400),*(size_t *)((long)state + 0x198),stack);
              }
              pwVar6 = pwVar6 + m * 2 + 2;
              if (*(void **)((long)state + 0x1a0) != (void *)0x0) {
                beltHashStepH(*(void **)((long)state + 0x1a0),*(size_t *)((long)state + 0x1a8),stack
                             );
              }
              beltHashStepG((octet *)a,stack);
              eVar3 = 0;
              memSet(dest,'\0',0x10);
              memSet(pwVar6,0xff,0x10);
              beltKRPStart(stack,(octet *)a,0x20,(octet *)pwVar6);
              beltKRPStepG((octet *)((long)state + 0x1d8),0x20,(octet *)dest,stack);
              if ((*(int *)((long)state + 0x188) != 0) || (*(int *)((long)state + 0x18c) != 0)) {
                *(undefined1 *)dest = 1;
                key_ = (octet *)((long)state + 0x1f8);
                beltKRPStepG(key_,0x20,(octet *)dest,stack);
                if (*(int *)((long)state + 0x188) != 0) {
                  *(undefined1 *)dest = 0;
                  beltMACStart(stack,key_,0x20);
                  beltMACStepA(dest,0x10,stack);
                  bVar2 = beltMACStepV(in + count * 2,stack);
                  if (bVar2 == 0) {
                    return 0x209;
                  }
                }
                eVar3 = 0;
                if (*(int *)((long)state + 0x18c) != 0) {
                  beltMACStart(stack,key_,0x20);
                  beltMACStepA(pwVar6,0x10,stack);
                  beltMACStepG(out,stack);
                }
              }
            }
          }
        }
      }
    }
  }
  return eVar3;
}

Assistant:

err_t bakeBMQVStep4(octet out[], const octet in[], const bake_cert* certa,
	void* state)
{
	err_t code;
	bake_bmqv_o* s = (bake_bmqv_o*)state;
	size_t n, no;
	// стек
	word* Qa;			/* [2 * n] */
	word* Va;			/* [2 * n] */
	word* t;			/* [n / 2 + 1] */
	word* sb;			/* [n + n / 2 + 1] */
	octet* K;			/* [no] (совпадает с Qa) */
	octet* block0;		/* [16] (совпадает с t) */
	octet* block1;		/* [16] (следует за block0) */
	void* stack;
	// проверить входные данные
	if (!objIsOperable(s))
		return ERR_BAD_INPUT;
	n = s->ec->f->n, no = s->ec->f->no;
	if (!memIsValid(in, 2 * no + (s->settings->kca ? 8u : 0)) ||
		!memIsValid(out, s->settings->kcb ? 8u : 0) ||
		!memIsValid(certa, sizeof(bake_cert)) ||
		!memIsValid(certa->data, certa->len) ||
		certa->val == 0)
		return ERR_BAD_INPUT;
	ASSERT(memIsDisjoint2(out, s->settings->kcb ? 8u : 0, s, objKeep(s)));
	// раскладка стека
	Qa = objEnd(s, word);
	Va = Qa + 2 * n;
	t = Va + 2 * n;
	sb = t + n / 2 + 1;
	stack = sb + n + n / 2 + 1;
	K = (octet*)Qa;
	block0 = (octet*)t;
	block1 = block0 + 16;
	ASSERT(block1 + 16 <= (octet*)stack);
	// проверить certa
	code = certa->val((octet*)Qa, s->params, certa->data, certa->len);
	ERR_CALL_CHECK(code);
	if (!qrFrom(ecX(Qa), (octet*)Qa, s->ec->f, stack) ||
		!qrFrom(ecY(Qa, n), (octet*)Qa + no, s->ec->f, stack) ||
		!ecpIsOnA(Qa, s->ec, stack))
		return ERR_BAD_CERT;
	// Va <- in, Va \in E*?
	if (!qrFrom(ecX(Va), in, s->ec->f, stack) ||
		!qrFrom(ecY(Va, n), in + no, s->ec->f, stack) ||
		!ecpIsOnA(Va, s->ec, stack))
		return ERR_BAD_POINT;
	// t <- <beltHash(<Va>_2l || <Vb>_2l)>_l
	beltHashStart(stack);
	beltHashStepH(in, no, stack);
	beltHashStepH(s->Vb, no, stack);
	beltHashStepG2((octet*)t, no / 2, stack);
	wwFrom(t, t, no / 2);
	// sb <- (ub - (2^l + t)db) \mod q
	zzMul(sb, t, n / 2, s->d, n, stack);
	sb[n + n / 2] = zzAdd2(sb + n / 2, s->d, n);
	zzMod(sb, sb, n + n / 2 + 1, s->ec->order, n, stack);
	zzSubMod(sb, s->u, sb, s->ec->order, n);
	// K <- sb(Va - (2^l + t)Qa), K == O => K <- G
	t[n / 2] = 1;
	if (!ecMulA(Qa, Qa, s->ec, t, n / 2 + 1, stack))
		return ERR_BAD_PARAMS;
	if (!ecpSubAA(Va, Va, Qa, s->ec, stack))
		qrTo(K, s->ec->base, s->ec->f, stack);
	else
	{
		if (!ecMulA(Va, Va, s->ec, sb, n, stack))
			return ERR_BAD_PARAMS;
		qrTo(K, ecX(Va), s->ec->f, stack);
	}
	// K <- beltHash(<K>_2l || certa || certb || helloa || hellob)
	beltHashStart(stack);
	beltHashStepH(K, no, stack);
	beltHashStepH(certa->data, certa->len, stack);
	beltHashStepH(s->cert->data, s->cert->len, stack);
	if (s->settings->helloa)
		beltHashStepH(s->settings->helloa, s->settings->helloa_len, stack);
	if (s->settings->hellob)
		beltHashStepH(s->settings->hellob, s->settings->hellob_len, stack);
	beltHashStepG(K, stack);
	// K0 <- beltKRP(K, 1^96, 0)
	memSetZero(block0, 16);
	memSet(block1, 0xFF, 16);
	beltKRPStart(stack, K, 32, block1);
	beltKRPStepG(s->K0, 32, block0, stack);
	// K1 <- beltKRP(K, 1^96, 1)
	if (s->settings->kca || s->settings->kcb)
	{
		block0[0] = 1;
		beltKRPStepG(s->K1, 32, block0, stack);
	}
	// Ta == beltMAC(0^128, K1)?
	if (s->settings->kca)
	{
		block0[0] = 0;
		beltMACStart(stack, s->K1, 32);
		beltMACStepA(block0, 16, stack);
		if (!beltMACStepV(in + 2 * no, stack))
			return ERR_AUTH;
	}
	// Tb <- beltMAC(1^128, K1)?
	if (s->settings->kcb)
	{
		beltMACStart(stack, s->K1, 32);
		beltMACStepA(block1, 16, stack);
		beltMACStepG(out, stack);
	}
	// все нормально
	return ERR_OK;
}